

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

bool __thiscall TasgridWrapper::checkSanePostRead(TasgridWrapper *this)

{
  int iVar1;
  TypeCommand TVar2;
  long lVar3;
  long *plVar4;
  char cVar5;
  byte bVar6;
  undefined1 uVar7;
  bool bVar8;
  TypeCommand TVar9;
  int iVar10;
  bool bVar11;
  test_result_wrapper test;
  command_tester com;
  test_result_wrapper local_d1;
  command_tester local_d0;
  array<TypeCommand,_1UL> local_cc;
  _Vector_base<TypeCommand,_std::allocator<TypeCommand>_> local_c8;
  _Vector_base<TypeCommand,_std::allocator<TypeCommand>_> local_a8;
  undefined1 local_88 [16];
  pointer local_78;
  TypeCommand aTStack_70 [6];
  _Vector_base<TypeCommand,_std::allocator<TypeCommand>_> local_58;
  _Vector_base<TypeCommand,_std::allocator<TypeCommand>_> local_38;
  
  local_d0.command = this->command;
  local_d1.pass = true;
  lVar3 = *(long *)&this->field_0x8;
  if (((lVar3 == 0) || (*(int *)(lVar3 + 0x14) == 0)) || (*(int *)(lVar3 + 0x20) == 0)) {
    local_78 = (pointer)0x160000001e;
    aTStack_70[0] = command_refine_aniso;
    aTStack_70[1] = command_refine_surp;
    local_88._0_8_ = (pointer)0x1200000010;
    local_88._8_8_ = (pointer)0x1300000011;
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar8 = command_tester::inside<8ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                      (&local_d0,(array<TypeCommand,_8UL> *)local_88,
                       (vector<TypeCommand,_std::allocator<TypeCommand>_> *)&local_38);
    bVar11 = true;
  }
  else {
    bVar11 = false;
    bVar8 = false;
  }
  test_result_wrapper::fail_if(&local_d1,bVar8,"the grid has no loaded data");
  if (bVar11) {
    std::_Vector_base<TypeCommand,_std::allocator<TypeCommand>_>::~_Vector_base(&local_38);
  }
  if ((*(long *)&this->field_0x8 == 0) || (*(int *)(*(long *)&this->field_0x8 + 0x14) == 0)) {
    local_78 = (pointer)0x160000001e;
    aTStack_70[0] = command_refine_aniso;
    aTStack_70[1] = command_refine_surp;
    local_88._0_8_ = (pointer)0x1200000010;
    local_88._8_8_ = (pointer)0x1300000011;
    aTStack_70[2] = command_get_candidate_construction;
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar8 = command_tester::inside<9ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                      (&local_d0,(array<TypeCommand,_9UL> *)local_88,
                       (vector<TypeCommand,_std::allocator<TypeCommand>_> *)&local_58);
    bVar11 = true;
  }
  else {
    bVar11 = false;
    bVar8 = false;
  }
  test_result_wrapper::fail_if(&local_d1,bVar8,"the grid has no outputs");
  if (bVar11) {
    std::_Vector_base<TypeCommand,_std::allocator<TypeCommand>_>::~_Vector_base(&local_58);
  }
  iVar1 = this->ref_output;
  if (*(long *)&this->field_0x8 == 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = *(int *)(*(long *)&this->field_0x8 + 0x14);
  }
  if (iVar1 < iVar10) {
    bVar11 = false;
  }
  else {
    local_a8._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_a8._M_impl.super__Vector_impl_data._M_start._4_4_,0x13);
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_78 = (pointer)0x0;
    bVar11 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                       (&local_d0,(array<TypeCommand,_1UL> *)&local_a8,
                        (vector<TypeCommand,_std::allocator<TypeCommand>_> *)local_88);
  }
  test_result_wrapper::fail_if
            (&local_d1,bVar11,"-refout outside of the range, note the outputs are indexed from zero"
            );
  if (iVar10 <= iVar1) {
    std::_Vector_base<TypeCommand,_std::allocator<TypeCommand>_>::~_Vector_base
              ((_Vector_base<TypeCommand,_std::allocator<TypeCommand>_> *)local_88);
  }
  if (((this->ref_output == -1) && (plVar4 = *(long **)&this->field_0x8, plVar4 != (long *)0x0)) &&
     ((1 < *(int *)((long)plVar4 + 0x14) && (cVar5 = (**(code **)(*plVar4 + 0x10))(), cVar5 != '\0')
      ))) {
    local_c8._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_c8._M_impl.super__Vector_impl_data._M_start._4_4_,0x13);
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar8 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                      (&local_d0,(array<TypeCommand,_1UL> *)&local_c8,
                       (vector<TypeCommand,_std::allocator<TypeCommand>_> *)&local_a8);
    bVar11 = true;
  }
  else {
    bVar11 = false;
    bVar8 = false;
  }
  test_result_wrapper::fail_if
            (&local_d1,bVar8,"-refout cannot use -1 when working with Global grids");
  if (bVar11) {
    std::_Vector_base<TypeCommand,_std::allocator<TypeCommand>_>::~_Vector_base(&local_a8);
  }
  if ((*(long **)&this->field_0x8 == (long *)0x0) ||
     ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))(), cVar5 == '\0' &&
      ((*(long **)&this->field_0x8 == (long *)0x0 ||
       (cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x28))(), cVar5 == '\0')))))) {
    bVar11 = false;
  }
  else {
    bVar11 = this->command == command_refine_aniso;
  }
  test_result_wrapper::fail_if
            (&local_d1,bVar11,
             "anisotropic operations are available only for Global, Sequence and Fourier grids");
  if (*(long **)&this->field_0x8 == (long *)0x0) {
    bVar6 = 0;
  }
  else {
    bVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
  }
  test_result_wrapper::fail_if
            (&local_d1,(bool)(this->command == command_refine_surp & bVar6),
             "surplus refinement cannot be applied to Fourier grids");
  TVar2 = this->command;
  if (TVar2 == command_refine_aniso) {
LAB_0012bb0c:
    if (*(long **)&this->field_0x8 == (long *)0x0) {
LAB_0012bb34:
      uVar7 = false;
    }
    else {
      cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))();
      uVar7 = true;
      if (cVar5 == '\0') {
        if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012bb34;
        uVar7 = (**(code **)(**(long **)&this->field_0x8 + 0x28))();
      }
    }
    test_result_wrapper::fail_if
              (&local_d1,(bool)uVar7,
               "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
    test_result_wrapper::fail_if
              (&local_d1,this->depth_type == type_none,
               "anisotropic refinement requires depth type with -tt");
    if ((((this->ref_output == -1) && (plVar4 = *(long **)&this->field_0x8, plVar4 != (long *)0x0))
        && (1 < *(int *)((long)plVar4 + 0x14))) &&
       (cVar5 = (**(code **)(*plVar4 + 0x10))(), cVar5 != '\0')) {
      local_cc._M_elems[0] = (_Type)command_getanisocoeff;
      local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar8 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                        (&local_d0,&local_cc,
                         (vector<TypeCommand,_std::allocator<TypeCommand>_> *)&local_c8);
      bVar11 = true;
    }
    else {
      bVar11 = false;
      bVar8 = false;
    }
    test_result_wrapper::fail_if
              (&local_d1,bVar8,"-refout cannot use -1 when working with Global grids");
    if (bVar11) {
      std::_Vector_base<TypeCommand,_std::allocator<TypeCommand>_>::~_Vector_base(&local_c8);
    }
    test_result_wrapper::worry_if
              (&local_d1,this->set_tolerance,
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option"
              );
    test_result_wrapper::worry_if
              (&local_d1,this->set_tref,
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option"
              );
LAB_0012bbcf:
    TVar9 = this->command;
  }
  else if ((TVar2 == command_get_candidate_construction) || (TVar9 = TVar2, TVar2 == command_refine)
          ) {
    if ((*(long **)&this->field_0x8 != (long *)0x0) &&
       ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x10))(), cVar5 != '\0' ||
        ((*(long **)&this->field_0x8 != (long *)0x0 &&
         ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x18))(), cVar5 != '\0' ||
          ((*(long **)&this->field_0x8 != (long *)0x0 &&
           (cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x30))(), cVar5 != '\0'))))))))))
    goto LAB_0012bb0c;
    goto LAB_0012bbcf;
  }
  if (TVar9 == command_refine_surp) goto LAB_0012bbda;
  if ((TVar2 == command_get_candidate_construction) || (TVar2 == command_refine)) {
    if (*(long **)&this->field_0x8 != (long *)0x0) {
      cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))();
      if (cVar5 == '\0') {
        if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012bcda;
        cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x28))();
        if (cVar5 == '\0') goto LAB_0012bca8;
      }
LAB_0012bbda:
      test_result_wrapper::fail_if
                (&local_d1,(bool)(this->set_tolerance ^ 1),
                 "must specify -tolerance for surplus refinement");
      test_result_wrapper::fail_if
                (&local_d1,(bool)(this->set_tref ^ 1),"must specify -reftype option");
      if (((this->valsfilename)._M_string_length == 0) ||
         (*(long **)&this->field_0x8 == (long *)0x0)) {
LAB_0012bc91:
        uVar7 = false;
      }
      else {
        cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x10))();
        uVar7 = true;
        if (cVar5 == '\0') {
          if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012bc91;
          cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x18))();
          if (cVar5 == '\0') {
            if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012bc91;
            uVar7 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
          }
        }
      }
      test_result_wrapper::worry_if
                (&local_d1,(bool)uVar7,
                 "the scale factors are not used with Global, Sequence and Fourier grids");
      goto LAB_0012bca8;
    }
  }
  else {
LAB_0012bca8:
    if ((*(long **)&this->field_0x8 != (long *)0x0) &&
       ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))(), cVar5 != '\0' ||
        ((*(long **)&this->field_0x8 != (long *)0x0 &&
         (cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x28))(), cVar5 != '\0')))))) {
      bVar11 = this->command == command_getpoly;
      goto LAB_0012bcdc;
    }
  }
LAB_0012bcda:
  bVar11 = false;
LAB_0012bcdc:
  test_result_wrapper::fail_if
            (&local_d1,bVar11,"cannot call -getpoly for a grid that is neither Global nor Sequence")
  ;
  return local_d1.pass;
}

Assistant:

bool TasgridWrapper::checkSanePostRead() const{
    command_tester com{command};
    test_result_wrapper test;

    test.fail_if(grid.getNumLoaded() == 0 and
                 com.inside(CArr<8>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp}),
                 "the grid has no loaded data");
    test.fail_if(grid.getNumOutputs() == 0 and
                 com.inside(CArr<9>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp,
                             command_get_candidate_construction}),
                 "the grid has no outputs");

    test.fail_if(ref_output >= grid.getNumOutputs() and
                 com.inside(CArr<1>{command_getanisocoeff, }),
                 "-refout outside of the range, note the outputs are indexed from zero");
    test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                 com.inside(CArr<1>{command_getanisocoeff}),
                 "-refout cannot use -1 when working with Global grids");

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_refine_aniso,
                 "anisotropic operations are available only for Global, Sequence and Fourier grids");
    test.fail_if((grid.isFourier() and command == command_refine_surp),
                 "surplus refinement cannot be applied to Fourier grids");

    bool is_refine = (command == command_refine or command == command_get_candidate_construction);
    if (command == command_refine_aniso or (is_refine and (grid.isGlobal() or grid.isSequence() or grid.isFourier()))){
        test.fail_if(grid.isLocalPolynomial() or grid.isWavelet(),
                     "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
        test.fail_if(depth_type == type_none, "anisotropic refinement requires depth type with -tt");
        test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                     com.inside(CArr<1>{command_getanisocoeff}),
                     "-refout cannot use -1 when working with Global grids");

        test.worry_if(set_tolerance, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option");
        test.worry_if(set_tref, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option");
    }

    if (command == command_refine_surp or (is_refine and (grid.isLocalPolynomial() or grid.isWavelet()))){
        test.fail_if(not set_tolerance, "must specify -tolerance for surplus refinement");
        test.fail_if(not set_tref, "must specify -reftype option");

        test.worry_if(not valsfilename.empty() and (grid.isGlobal() or grid.isSequence() or grid.isFourier()),
                      "the scale factors are not used with Global, Sequence and Fourier grids");
    }

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_getpoly,
                 "cannot call -getpoly for a grid that is neither Global nor Sequence");

    return test;
}